

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  Name memory;
  undefined1 this_00 [8];
  bool bVar1;
  Index bytes;
  int iVar2;
  Address AVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined1 local_2c0 [8];
  array<wasm::Literal,_16UL> lanes;
  Literal local_128;
  Literal local_110;
  Literal local_f8;
  Literal local_e0;
  undefined1 auStack_c8 [8];
  Literal vec;
  Flow local_a8;
  anon_union_16_5_9943fe1e_for_Literal_0 local_60;
  undefined8 local_50;
  undefined1 local_48 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            (&local_a8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (local_a8.breakTo.super_IString.str._M_str == (char *)0x0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_48,this,(Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    AVar3 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_48,memory);
    this_00 = local_48;
    if (((long)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        local_a8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) {
LAB_005faec2:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    Literal::Literal((Literal *)&lanes._M_elems[0xf].type,
                     local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    bytes = SIMDLoadStoreLane::getMemBytes(curr);
    AVar3 = getFinalAddress<wasm::SIMDLoadStoreLane>
                      ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                       (Literal *)&lanes._M_elems[0xf].type,bytes,AVar3);
    Literal::~Literal((Literal *)&lanes._M_elems[0xf].type);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_2c0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->vec);
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = (size_t)local_2c0;
    Literal::operator=(local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems,
                       lanes._M_elems);
    vec.field_0.func.super_IString.str._M_str =
         (char *)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    vec.field_0.i64 =
         (int64_t)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    auStack_c8 = (undefined1  [8])
                 local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)lanes._M_elems[1].field_0.i64;
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)lanes._M_elems[1].field_0.func.super_IString.str._M_str;
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)lanes._M_elems[1].type.id;
    lanes._M_elems[1].field_0.i64 = 0;
    lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[1].type.id = 0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_c8);
    local_a8.breakTo.super_IString.str._M_len = lanes._M_elems[2].field_0.i64;
    local_a8.breakTo.super_IString.str._M_str =
         lanes._M_elems[2].field_0.func.super_IString.str._M_str;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)(lanes._M_elems + 1));
    Literal::~Literal(lanes._M_elems);
    if (local_a8.breakTo.super_IString.str._M_str == (char *)0x0) {
      if (((long)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          local_a8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) goto LAB_005faec2;
      Literal::Literal((Literal *)auStack_c8,
                       local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
      switch(curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128:
        Literal::getLanesUI8x16((LaneArray<16> *)local_2c0,(Literal *)auStack_c8);
        bVar1 = SIMDLoadStoreLane::isStore(curr);
        if (bVar1) {
          if (lanes._M_elems[curr->index].field_0.func.super_IString.str._M_str != (char *)0x2) {
LAB_005faee1:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                          ,0x118,"int32_t wasm::Literal::geti32() const");
          }
          (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x16])
                    (*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,
                     (ulong)(uint)(int)(char)lanes._M_elems[(ulong)curr->index - 1].type.id,
                     info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        else {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0xe])
                            (*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,
                             info.instance,info.name.super_IString.str._M_len);
          local_60.func.super_IString.str._M_len =
               CONCAT44(local_60.i64._4_4_,iVar2) & 0xffffffff000000ff;
          local_50 = 2;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&local_60.func);
          Literal::~Literal((Literal *)&local_60.func);
          Literal::Literal(&local_128,(LaneArray<16> *)local_2c0);
          Flow::Flow(__return_storage_ptr__,&local_128);
          Literal::~Literal(&local_128);
        }
        lVar4 = 0x168;
        do {
          Literal::~Literal((Literal *)((long)(lanes._M_elems + -1) + 0x10 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case Load16LaneVec128:
      case Store16LaneVec128:
        Literal::getLanesUI16x8((LaneArray<8> *)local_2c0,(Literal *)auStack_c8);
        bVar1 = SIMDLoadStoreLane::isStore(curr);
        if (bVar1) {
          if (lanes._M_elems[curr->index].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_005faee1;
          (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x17])
                    (*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,
                     (ulong)(uint)(int)(short)lanes._M_elems[(ulong)curr->index - 1].type.id,
                     info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        else {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x10]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          local_60.func.super_IString.str._M_len =
               CONCAT44(local_60.i64._4_4_,iVar2) & 0xffffffff0000ffff;
          local_50 = 2;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&local_60.func);
          Literal::~Literal((Literal *)&local_60.func);
          Literal::Literal(&local_110,(LaneArray<8> *)local_2c0);
          Flow::Flow(__return_storage_ptr__,&local_110);
          Literal::~Literal(&local_110);
        }
        lVar4 = 0xa8;
        do {
          Literal::~Literal((Literal *)((long)(lanes._M_elems + -1) + 0x10 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case Load32LaneVec128:
      case Store32LaneVec128:
        Literal::getLanesI32x4((LaneArray<4> *)local_2c0,(Literal *)auStack_c8);
        bVar1 = SIMDLoadStoreLane::isStore(curr);
        if (bVar1) {
          if (lanes._M_elems[curr->index].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_005faee1;
          (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x18])
                    (*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,
                     (ulong)(uint)lanes._M_elems[(ulong)curr->index - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        else {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x12]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          local_60.i32 = iVar2;
          local_50 = 2;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&local_60.func);
          Literal::~Literal((Literal *)&local_60.func);
          Literal::Literal(&local_f8,(LaneArray<4> *)local_2c0);
          Flow::Flow(__return_storage_ptr__,&local_f8);
          Literal::~Literal(&local_f8);
        }
        lVar4 = 0x48;
        do {
          Literal::~Literal((Literal *)((long)(lanes._M_elems + -1) + 0x10 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case Load64LaneVec128:
      case Store64LaneVec128:
        Literal::getLanesI64x2((LaneArray<2> *)local_2c0,(Literal *)auStack_c8);
        bVar1 = SIMDLoadStoreLane::isStore(curr);
        if (bVar1) {
          if (lanes._M_elems[curr->index].field_0.func.super_IString.str._M_str != (char *)0x3) {
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                          ,0x121,"int64_t wasm::Literal::geti64() const");
          }
          (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x19])
                    (*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,
                     lanes._M_elems[(ulong)curr->index - 1].type.id,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        else {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x288))->_vptr_ExternalInterface[0x14]
                  )(*(ExternalInterface **)((long)local_48 + 0x288),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          local_60.i64 = CONCAT44(extraout_var,iVar2);
          local_50 = 3;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&local_60.func);
          Literal::~Literal((Literal *)&local_60.func);
          Literal::Literal(&local_e0,(LaneArray<2> *)local_2c0);
          Flow::Flow(__return_storage_ptr__,&local_e0);
          Literal::~Literal(&local_e0);
        }
        lVar4 = 0x18;
        do {
          Literal::~Literal((Literal *)((long)(lanes._M_elems + -1) + 0x10 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      default:
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0xd3b);
      }
      Literal::~Literal((Literal *)auStack_c8);
      goto LAB_005fa989;
    }
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len =
       (undefined4)local_a8.breakTo.super_IString.str._M_len;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) =
       local_a8.breakTo.super_IString.str._M_len._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str =
       local_a8.breakTo.super_IString.str._M_str._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) =
       local_a8.breakTo.super_IString.str._M_str._4_4_;
LAB_005fa989:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            (&local_a8.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
  Literal::~Literal(local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }